

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

PAL_ERROR CorUnix::InternalReadFile
                    (CPalThread *pThread,HANDLE hFile,LPVOID lpBuffer,DWORD nNumberOfBytesToRead,
                    LPDWORD lpNumberOfBytesRead,LPOVERLAPPED lpOverlapped)

{
  int iUnixFd;
  byte bVar1;
  PAL_ERROR PVar2;
  ssize_t sVar3;
  int *piVar4;
  undefined8 *local_60;
  IFileTransactionLock *pTransactionLock;
  long *local_50;
  IPalObject *pFileObject;
  CFileProcessLocalData *pLocalData;
  IDataLock *pLocalDataLock;
  LONG readOffsetStartLow;
  LONG readOffsetStartHigh;
  
  local_50 = (long *)0x0;
  pFileObject = (IPalObject *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  local_60 = (undefined8 *)0x0;
  pLocalDataLock._0_4_ = 0;
  pLocalDataLock._4_4_ = 0;
  if (lpNumberOfBytesRead == (LPDWORD)0x0) {
    if (!PAL_InitializeChakraCoreCalled) goto LAB_001240a6;
  }
  else {
    *lpNumberOfBytesRead = 0;
    if (hFile == (HANDLE)0xffffffffffffffff) {
      if (PAL_InitializeChakraCoreCalled != false) {
        PVar2 = 6;
        goto LAB_00123ff8;
      }
      goto LAB_001240a6;
    }
    if (lpOverlapped == (LPOVERLAPPED)0x0) {
      if (lpBuffer == (LPVOID)0x0) {
        PVar2 = 0x3e6;
LAB_0012409d:
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_001240a6:
          abort();
        }
      }
      else {
        PVar2 = (**(code **)(*g_pObjectManager + 0x28))
                          (g_pObjectManager,pThread,hFile,aotFile,0x80000000,&local_50);
        if ((PVar2 != 0) ||
           (PVar2 = (**(code **)(*local_50 + 0x18))(local_50,pThread,0,&pLocalData,&pFileObject),
           PVar2 != 0)) goto LAB_00123ff8;
        if (*(int *)((long)&pFileObject[2]._vptr_IPalObject + 4) == 1) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_001240a6;
          PVar2 = 5;
          goto LAB_00123ff8;
        }
        iUnixFd = *(int *)&pFileObject[1]._vptr_IPalObject;
        if (pFileObject->_vptr_IPalObject != (_func_int **)0x0) {
          PVar2 = InternalSetFilePointerForUnixFd
                            (iUnixFd,0,(PLONG)((long)&pLocalDataLock + 4),1,(PLONG)&pLocalDataLock);
          if (PVar2 != 0) {
            fprintf(_stderr,"] %s %s:%d","InternalReadFile",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
                    ,0x92f);
            fprintf(_stderr,"Failed to get the current file position\n");
            PVar2 = 0x54f;
            goto LAB_00123ff8;
          }
          PVar2 = (**(code **)*pFileObject->_vptr_IPalObject)
                            (pFileObject->_vptr_IPalObject,pThread,0,pLocalDataLock._0_4_,
                             pLocalDataLock._4_4_,nNumberOfBytesToRead,0,&local_60);
          if (PVar2 != 0) goto LAB_0012409d;
        }
        pTransactionLock._4_4_ = iUnixFd;
        (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
        pLocalData = (CFileProcessLocalData *)0x0;
        pFileObject = (IPalObject *)0x0;
        bVar1 = PAL_InitializeChakraCoreCalled;
        do {
          if (((bVar1 & 1) == 0) ||
             (sVar3 = read(pTransactionLock._4_4_,lpBuffer,(ulong)nNumberOfBytesToRead),
             bVar1 = PAL_InitializeChakraCoreCalled, PAL_InitializeChakraCoreCalled == false))
          goto LAB_001240a6;
          if (-1 < (int)(DWORD)sVar3) {
            *lpNumberOfBytesRead = (DWORD)sVar3;
            PVar2 = 0;
            goto LAB_00123ff8;
          }
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        PVar2 = FILEGetLastErrorFromErrno();
      }
      goto LAB_00123ff8;
    }
    fprintf(_stderr,"] %s %s:%d","InternalReadFile",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_file.cpp"
            ,0x8f0);
    fprintf(_stderr,"lpOverlapped is not NULL, as it should be.\n");
  }
  PVar2 = 0x57;
LAB_00123ff8:
  if (local_60 != (undefined8 *)0x0) {
    (**(code **)*local_60)();
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pThread,0);
  }
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 0x40))(local_50,pThread);
  }
  return PVar2;
}

Assistant:

PAL_ERROR
CorUnix::InternalReadFile(
    CPalThread *pThread,
    HANDLE hFile,
    LPVOID lpBuffer,
    DWORD nNumberOfBytesToRead,
    LPDWORD lpNumberOfBytesRead,
    LPOVERLAPPED lpOverlapped
    )
{
    PAL_ERROR palError = 0;
    IPalObject *pFileObject = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IDataLock *pLocalDataLock = NULL;
    IFileTransactionLock *pTransactionLock = NULL;
    int ifd;
    
    LONG readOffsetStartLow = 0, readOffsetStartHigh = 0;
    int res;

    if (NULL != lpNumberOfBytesRead)
    {
        //
        // This must be set to 0 before any other error checking takes
        // place, per MSDN
        //

        *lpNumberOfBytesRead = 0;        
    }
    else
    {
        ERROR( "lpNumberOfBytesRead is NULL\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    if (INVALID_HANDLE_VALUE == hFile)
    {
        ERROR( "Invalid file handle\n" );
        palError = ERROR_INVALID_HANDLE;
        goto done;
    }
    else if (NULL != lpOverlapped)
    {
        ASSERT( "lpOverlapped is not NULL, as it should be.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto done;
    }
    else if (NULL == lpBuffer)
    {
        ERROR( "Invalid parameter. (lpBuffer:%p)\n", lpBuffer);
        palError = ERROR_NOACCESS;
        goto done;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pThread,
        hFile,
        &aotFile,
        GENERIC_READ,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        ReadLock, 
        &pLocalDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    if (pLocalData->open_flags_deviceaccessonly == TRUE)
    {
        ERROR("File open for device access only\n");
        palError = ERROR_ACCESS_DENIED;
        goto done;
    }

    ifd = pLocalData->unix_fd;

    //
    // Inform the lock controller for this file (if any) of our intention
    // to perform a read. (Note that pipes don't have lock controllers.)
    //
    
    if (NULL != pLocalData->pLockController)
    {
        /* Get the current file position to calculate the region to lock */
        palError = InternalSetFilePointerForUnixFd(
            ifd,
            0,
            &readOffsetStartHigh,
            FILE_CURRENT,
            &readOffsetStartLow
            );

        if (NO_ERROR != palError)
        {
            ASSERT("Failed to get the current file position\n");
            palError = ERROR_INTERNAL_ERROR;
            goto done;
        }

        palError = pLocalData->pLockController->GetTransactionLock(
            pThread,
            IFileLockController::ReadLock,
            readOffsetStartLow,
            readOffsetStartHigh,
            nNumberOfBytesToRead,
            0,
            &pTransactionLock
            );

        if (NO_ERROR != palError)
        {
            ERROR("Unable to obtain read transaction lock");
            goto done;
        }
    }

    //
    // Release the data lock before performing the (possibly blocking)
    // read call
    //

    pLocalDataLock->ReleaseLock(pThread, FALSE);
    pLocalDataLock = NULL;
    pLocalData = NULL;

Read:
    TRACE("Reading from file descriptor %d\n", ifd);
    res = read(ifd, lpBuffer, nNumberOfBytesToRead);
    TRACE("read() returns %d\n", res);

    if (res >= 0)
    {
        *lpNumberOfBytesRead = res;
    }
    else if (errno == EINTR)
    {
        // Try to read again.
        goto Read;
    }
    else
    {
        palError = FILEGetLastErrorFromErrno();
    }
    
done:

    if (NULL != pTransactionLock)
    {
        pTransactionLock->ReleaseLock();
    }

    if (NULL != pLocalDataLock)
    {
        pLocalDataLock->ReleaseLock(pThread, FALSE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    return palError;
}